

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramsurface.hpp
# Opt level: O1

bool __thiscall ParamSurface::intersect(ParamSurface *this,Ray *ray,Hit *result)

{
  long lVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  bool bVar9;
  Ray *pRVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  float *pfVar17;
  long lVar18;
  ulong uVar19;
  float *pfVar20;
  float *pfVar21;
  float fVar22;
  float extraout_XMM0_Da;
  undefined8 extraout_XMM0_Qa;
  float extraout_XMM0_Db;
  undefined1 auVar23 [16];
  float fVar24;
  undefined1 auVar25 [16];
  float fVar26;
  float fVar27;
  float fVar28;
  mat3f res;
  Hit tmpresult;
  Ray forwardray;
  float local_158;
  float fStack_154;
  float local_150;
  float local_148;
  float fStack_144;
  float local_140;
  undefined1 local_138 [16];
  float local_128 [10];
  float local_100 [10];
  undefined8 local_d8;
  float fStack_d0;
  float fStack_cc;
  vec2f local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  Hit *local_a0;
  Ray *local_98;
  undefined1 local_90;
  undefined8 local_8c;
  undefined8 uStack_84;
  undefined8 local_7c;
  undefined8 uStack_74;
  undefined4 local_6c;
  float fStack_68;
  float fStack_64;
  undefined4 uStack_60;
  undefined8 local_5c;
  undefined8 uStack_54;
  undefined4 local_4c;
  undefined8 local_48;
  float local_40;
  undefined8 local_3c;
  float local_34;
  
  local_90 = 0;
  local_8c = 0;
  uStack_84 = 0;
  local_7c = 0;
  uStack_74 = 0;
  local_6c = 0;
  fStack_68 = 0.0;
  fStack_64 = 0.0;
  uStack_60 = 0;
  local_5c = 0;
  uStack_54 = 0;
  local_4c = 0;
  local_34 = (ray->dir).z;
  local_3c._0_4_ = (ray->dir).x;
  local_3c._4_4_ = (ray->dir).y;
  uVar5 = (ray->origin).x;
  uVar6 = (ray->origin).y;
  local_40 = local_34 * 0.01 + (ray->origin).z;
  local_48 = CONCAT44((float)uVar6 + (float)local_3c._4_4_ * 0.01,
                      (float)uVar5 + (float)(undefined4)local_3c * 0.01);
  local_d8 = this;
  iVar11 = (**(this->mesh->super_Primitive)._vptr_Primitive)();
  if ((char)iVar11 == '\0') {
    bVar9 = false;
  }
  else {
    fVar24 = (float)local_8c - (ray->origin).x;
    fVar26 = local_8c._4_4_ - (ray->origin).y;
    fVar22 = (float)uStack_84 - (ray->origin).z;
    local_138._0_4_ = fVar22 * fVar22 + fVar24 * fVar24 + fVar26 * fVar26;
    local_a0 = result;
    if ((float)local_138._0_4_ < 0.0) {
      local_138._0_4_ = sqrtf((float)local_138._0_4_);
    }
    else {
      local_138._0_4_ = SQRT((float)local_138._0_4_);
    }
    auVar25._0_8_ = (double)fStack_68;
    auVar25._8_8_ = (double)fStack_64;
    auVar25 = maxpd(auVar25,ZEXT816(0));
    auVar25 = minpd(auVar25,_DAT_00157790);
    local_148 = 0.0;
    fStack_144 = 0.0;
    local_140 = 0.0;
    local_158 = 0.0;
    fStack_154 = 0.0;
    local_150 = 0.0;
    fVar24 = (float)auVar25._0_8_;
    fVar22 = (float)auVar25._8_8_;
    iVar11 = 0;
    local_98 = ray;
    do {
      pRVar10 = local_98;
      local_c8 = (vec2f)CONCAT44(fVar22,fVar24);
      uStack_c0 = 0;
      (*(local_d8->super_Primitive)._vptr_Primitive[3])(local_d8,&local_148,&local_158);
      fVar24 = (pRVar10->dir).x;
      fVar26 = (pRVar10->dir).z;
      fVar28 = (pRVar10->origin).x;
      fVar2 = (pRVar10->origin).z;
      fVar27 = (float)((ulong)extraout_XMM0_Qa >> 0x20) -
               ((pRVar10->dir).y * (float)local_138._0_4_ + (pRVar10->origin).y);
      fVar3 = (pRVar10->dir).y;
      fVar4 = (pRVar10->dir).z;
      local_100[0] = -fVar24;
      local_100[1] = local_148;
      local_100[2] = local_158;
      local_100[3] = -fVar3;
      local_100[4] = fStack_144;
      local_100[5] = fStack_154;
      local_100[6] = -fVar4;
      local_100[7] = local_140;
      local_100[8] = local_150;
      local_128[0] = 0.0;
      local_128[1] = 0.0;
      local_128[2] = 0.0;
      local_128[3] = 0.0;
      local_128[4] = 0.0;
      local_128[5] = 0.0;
      local_128[6] = 0.0;
      local_128[7] = 0.0;
      local_128[8] = 0.0;
      uVar13 = 2;
      pfVar21 = local_100 + 8;
      pfVar17 = local_128;
      lVar18 = 0;
      do {
        auVar7._8_8_ = 0;
        auVar7._0_8_ = uVar13;
        lVar14 = lVar18 + 1;
        local_b8 = lVar14;
        if (lVar14 == 3) {
          lVar14 = 0;
        }
        uVar19 = 2;
        lVar16 = 0;
        pfVar20 = pfVar17;
        do {
          auVar8._8_8_ = 0;
          auVar8._0_8_ = uVar19;
          uVar15 = SUB168(auVar8 * ZEXT816(0xaaaaaaaaaaaaaaab),8) * 2 & 0xfffffffffffffffc;
          lVar1 = lVar16 + 1;
          lVar12 = 0;
          if (lVar16 != 2) {
            lVar12 = lVar1;
          }
          *pfVar20 = (local_100[lVar14 * 3 + lVar12] *
                      *(float *)((long)pfVar21 +
                                lVar16 * 4 +
                                uVar15 * -3 +
                                (SUB168(auVar7 * ZEXT816(0xaaaaaaaaaaaaaaab),8) * 2 &
                                0xfffffffffffffffcU) * -9) -
                     *(float *)((long)local_100 + lVar16 * 4 + uVar15 * -3 + lVar14 * 0xc + 8) *
                     local_100[(ulong)(((int)lVar18 + 2U) % 3) * 3 + lVar12]) *
                     (1.0 / (fStack_144 * local_158 * fVar4 +
                            fVar3 * local_148 * local_150 +
                            fStack_154 * fVar24 * local_140 +
                            ((-fVar24 * fStack_144 * local_150 - local_148 * fStack_154 * fVar4) -
                            local_158 * fVar3 * local_140)));
          pRVar10 = local_98;
          pfVar20 = pfVar20 + 3;
          uVar19 = uVar19 + 1;
          lVar16 = lVar1;
        } while (lVar1 != 3);
        pfVar17 = pfVar17 + 1;
        pfVar21 = pfVar21 + 3;
        uVar13 = uVar13 + 1;
        lVar18 = local_b8;
      } while (local_b8 != 3);
      fVar24 = (float)extraout_XMM0_Qa - (fVar24 * (float)local_138._0_4_ + fVar28);
      fVar22 = fVar22 - (fVar26 * (float)local_138._0_4_ + fVar2);
      local_138._0_4_ =
           (float)local_138._0_4_ -
           (local_128[2] * fVar22 + local_128[0] * fVar24 + local_128[1] * fVar27);
      auVar23._0_8_ =
           (double)(local_c8.x -
                   (fVar22 * local_128[5] + fVar24 * local_128[3] + local_128[4] * fVar27));
      auVar23._8_8_ =
           (double)(local_c8.y -
                   (fVar22 * local_128[8] + fVar24 * local_128[6] + local_128[7] * fVar27));
      auVar25 = maxpd(auVar23,ZEXT816(0));
      auVar25 = minpd(auVar25,_DAT_00157790);
      iVar11 = iVar11 + 1;
      fVar24 = (float)auVar25._0_8_;
      fVar22 = (float)auVar25._8_8_;
    } while (iVar11 != 5);
    local_c8.y = fVar22;
    local_c8.x = fVar24;
    uStack_c0 = 0;
    (*(local_d8->super_Primitive)._vptr_Primitive[3])(local_d8,&local_148,&local_158);
    local_b8 = CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    fVar26 = extraout_XMM0_Da - ((pRVar10->dir).x * (float)local_138._0_4_ + (pRVar10->origin).x);
    fVar28 = extraout_XMM0_Db - ((pRVar10->dir).y * (float)local_138._0_4_ + (pRVar10->origin).y);
    fVar24 = fVar22 - ((pRVar10->dir).z * (float)local_138._0_4_ + (pRVar10->origin).z);
    fVar24 = fVar24 * fVar24 + fVar26 * fVar26 + fVar28 * fVar28;
    if (fVar24 < 0.0) {
      fVar24 = sqrtf(fVar24);
    }
    else {
      fVar24 = SQRT(fVar24);
    }
    bVar9 = 0.0 < (float)local_138._0_4_ && fVar24 < 1e-06;
    if (0.0 < (float)local_138._0_4_ && fVar24 < 1e-06) {
      local_d8._0_4_ = local_150 * fStack_144 - local_140 * fStack_154;
      local_d8._4_4_ = local_158 * local_140 - local_148 * local_150;
      fStack_d0 = local_150 * 0.0 - local_140 * 0.0;
      fStack_cc = local_150 * 0.0 - local_140 * 0.0;
      local_138._0_4_ = local_148 * fStack_154 - local_158 * fStack_144;
      fVar24 = (float)local_138._0_4_ * (float)local_138._0_4_ +
               (float)local_d8 * (float)local_d8 + local_d8._4_4_ * local_d8._4_4_;
      if (fVar24 < 0.0) {
        local_138 = ZEXT416((uint)local_138._0_4_);
        fVar24 = sqrtf(fVar24);
      }
      else {
        fVar24 = SQRT(fVar24);
      }
      fVar24 = 1.0 / fVar24;
      local_a0->hit = true;
      (local_a0->p).x = (float)(undefined4)local_b8;
      (local_a0->p).y = (float)local_b8._4_4_;
      (local_a0->p).z = fVar22;
      (local_a0->Ns).x = (float)local_d8 * fVar24;
      (local_a0->Ns).y = local_d8._4_4_ * fVar24;
      (local_a0->Ns).z = (float)local_138._0_4_ * fVar24;
      (local_a0->Ng).x = (float)local_d8 * fVar24;
      (local_a0->Ng).y = local_d8._4_4_ * fVar24;
      (local_a0->Ng).z = (float)local_138._0_4_ * fVar24;
      local_a0->uv = local_c8;
      (local_a0->dpdu).x = 0.0;
      (local_a0->dpdu).y = 0.0;
      *(undefined8 *)&(local_a0->dpdu).z = 0;
      (local_a0->dpdv).y = 0.0;
      (local_a0->dpdv).z = 0.0;
    }
  }
  return bVar9;
}

Assistant:

bool intersect(const Ray& ray, Hit* result) const
	{
		Hit tmpresult;
		Ray forwardray (ray.atParam(1e-2), ray.dir);
		bool boolres = mesh->intersect(forwardray, &tmpresult);
		if (!boolres) return false;
		// determine initial point
		float t = norm(tmpresult.p - ray.origin);
		float u = tmpresult.uv.x;
		float v = tmpresult.uv.y;
		u = fmin(1, fmax(0, u));
		v = fmin(1, fmax(0, v));
		vec3f p, dpdu, dpdv;
		// solve eqn(t,u,v): f(u,v) - origin - t * dir = 0
		for (int _=0; _<5; ++_)
		{
			p = surface(u,v,dpdu,dpdv) - ray.atParam(t);
			// vec3f t1,t2;
			// auto dpdu1 = (surface(u+1e-4,v,t1,t2)-surface(u,v,dpdu,dpdv))/1e-4;
			// auto dpdv1 = (surface(u,v+1e-4,t1,t2)-surface(u,v,dpdu,dpdv))/1e-4;
			// console.log(u,v);
			// console.log(dpdu, dpdv);
			// console.log(dpdu1, dpdv1);
			// console.log(norm(dpdu-dpdu1)/norm(dpdu), norm(dpdv-dpdv1)/norm(dpdv));
			// console.log(_,":",norm(p),",  ",t,u,v);
			// for (int i=0; i<3; ++i) for (int j=0; j<3; ++j)
			// console.log((inverse(mat3f(-ray.dir, dpdu, dpdv))*mat3f(-ray.dir, dpdu, dpdv))[i][j]);
			vec3f delt = inverse(mat3f(-ray.dir, dpdu, dpdv)) * p;
			t -= delt.x;
			u = fmin(1, fmax(0, u - delt.y));
			// v = v - delt.z;
			v = fmin(1, fmax(0, v - delt.z));
		}
		p = surface(u,v,dpdu,dpdv);
		if (norm(p-ray.atParam(t)) < 1e-6 && t>0) {
			vec3f N = normalized(cross(dpdu,dpdv));
			*result = {p,N,N,vec2f(u,v)};
			return true;
		}
		return false;
	}